

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

int AF_AActor_Activate(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                      VMReturn *ret,int numret)

{
  PClass *pPVar1;
  PClass *pPVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  long *plVar4;
  char *pcVar5;
  undefined8 *puVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  uVar3 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0042e9c8;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0042e9af:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0042e9c8:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x12f5,
                  "int AF_AActor_Activate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  plVar4 = (long *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (plVar4 == (long *)0x0) goto LAB_0042e913;
    auVar8._8_8_ = uVar3;
    auVar8._0_8_ = plVar4[1];
    if (plVar4[1] == 0) {
      auVar8 = (**(code **)*plVar4)(plVar4);
      plVar4[1] = auVar8._0_8_;
    }
    pPVar2 = auVar8._0_8_;
    bVar7 = pPVar2 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar7;
    uVar3 = (ulong)bVar7;
    defaultparam = (TArray<VMValue,_VMValue> *)(ulong)(pPVar2 == pPVar1 || bVar7);
    if (pPVar2 != pPVar1 && !bVar7) {
      do {
        pPVar2 = pPVar2->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar2 != (PClass *)0x0);
        if (pPVar2 == pPVar1) break;
      } while (pPVar2 != (PClass *)0x0);
    }
    if ((char)ret == '\0') {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0042e9c8;
    }
  }
  else {
    if (plVar4 != (long *)0x0) goto LAB_0042e9af;
LAB_0042e913:
    plVar4 = (long *)0x0;
  }
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_0042e9e7;
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    puVar6 = (undefined8 *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (puVar6 != (undefined8 *)0x0) {
        pPVar2 = (PClass *)puVar6[1];
        if (pPVar2 == (PClass *)0x0) {
          pPVar2 = (PClass *)(**(code **)*puVar6)(puVar6,defaultparam,uVar3,ret);
          puVar6[1] = pPVar2;
        }
        bVar7 = pPVar2 != (PClass *)0x0;
        if (pPVar2 != pPVar1 && bVar7) {
          do {
            pPVar2 = pPVar2->ParentClass;
            bVar7 = pPVar2 != (PClass *)0x0;
            if (pPVar2 == pPVar1) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if (!bVar7) {
          pcVar5 = "activator == NULL || activator->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0042e9e7;
        }
        goto LAB_0042e996;
      }
    }
    else if (puVar6 != (undefined8 *)0x0) goto LAB_0042e9b8;
    puVar6 = (undefined8 *)0x0;
LAB_0042e996:
    (**(code **)(*plVar4 + 0x68))(plVar4,puVar6);
    return 0;
  }
LAB_0042e9b8:
  pcVar5 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0042e9e7:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x12f6,"int AF_AActor_Activate(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, Activate)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_OBJECT(activator, AActor);
	self->Activate(activator);
	return 0;
}